

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O3

bool __thiscall Network::Client::Buffers::avanceQoS2(Buffers *this,uint32 ID)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = this->maxID;
  if ((ulong)bVar1 != 0) {
    uVar2 = 0;
    do {
      if ((*(uint *)(this->buffer + uVar2 * 4) & 0x1ffff) == ID) {
        if (bVar1 <= (byte)uVar2) {
          return false;
        }
        *(uint *)(this->buffer + uVar2 * 4) = *(uint *)(this->buffer + uVar2 * 4) | 0x40000000;
        return true;
      }
      uVar2 = uVar2 + 1;
    } while (bVar1 != uVar2);
  }
  return false;
}

Assistant:

inline bool avanceQoS2(uint32 ID)   { uint8 p = findID(ID); if (p == maxID) return false; packetsID()[p] |= 0x40000000; return true; }